

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void GREATEST_SET_TEARDOWN_CB(undefined1 *cb,void *udata)

{
  greatest_info.teardown = cb;
  greatest_info.teardown_udata = udata;
  return;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}